

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcStatesStates
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,int *states1,double *matrices1,
          int *states2,double *matrices2,int startPattern,int endPattern)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int state2;
  int state1;
  int k;
  int w;
  int v;
  int l;
  double *matrices2_local;
  int *states2_local;
  double *matrices1_local;
  int *states1_local;
  double *destP_local;
  BeagleCPU4StateImpl<double,_1,_0> *this_local;
  
  for (l = 0; l < (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount; l = l + 1) {
    v = l * 4 * (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
    if (startPattern != 0) {
      v = startPattern * 4 + v;
    }
    iVar3 = l * 0x14;
    for (k = startPattern; k < endPattern; k = k + 1) {
      iVar1 = states1[k];
      iVar2 = states2[k];
      destP[v] = matrices1[iVar3 + iVar1] * matrices2[iVar3 + iVar2];
      destP[v + 1] = matrices1[iVar3 + 5 + iVar1] * matrices2[iVar3 + 5 + iVar2];
      destP[v + 2] = matrices1[iVar3 + 10 + iVar1] * matrices2[iVar3 + 10 + iVar2];
      destP[v + 3] = matrices1[iVar3 + 0xf + iVar1] * matrices2[iVar3 + 0xf + iVar2];
      v = v + 4;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcStatesStates(REALTYPE* destP,
                                                               const int* states1,
                                                               const REALTYPE* matrices1,
                                                               const int* states2,
                                                               const REALTYPE* matrices2,
                                                               int startPattern,
                                                               int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          v += 4*startPattern;
        }

        int w = l*4*OFFSET;

        for (int k = startPattern; k < endPattern; k++) {

            const int state1 = states1[k];
            const int state2 = states2[k];

            destP[v    ] = matrices1[w            + state1] *
                           matrices2[w            + state2];
            destP[v + 1] = matrices1[w + OFFSET*1 + state1] *
                           matrices2[w + OFFSET*1 + state2];
            destP[v + 2] = matrices1[w + OFFSET*2 + state1] *
                           matrices2[w + OFFSET*2 + state2];
            destP[v + 3] = matrices1[w + OFFSET*3 + state1] *
                           matrices2[w + OFFSET*3 + state2];
           v += 4;
        }
    }
}